

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

int __thiscall
webfront::http::std::experimental::net::v1::detail::
reactive_socket_service<std::experimental::net::v1::ip::tcp>::open
          (reactive_socket_service<std::experimental::net::v1::ip::tcp> *this,char *__file,
          int __oflag,...)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *in_RCX;
  error_code eVar3;
  error_code *in_stack_00000010;
  int iStack000000000000001c;
  undefined8 in_stack_00000018;
  int iStack0000000000000020;
  int iStack0000000000000024;
  base_implementation_type *in_stack_00000028;
  reactive_socket_service_base *in_stack_00000030;
  error_code local_48;
  undefined8 *local_38;
  tcp *local_30;
  char *local_28;
  reactive_socket_service<std::experimental::net::v1::ip::tcp> *local_20;
  int local_18;
  
  uVar1 = _iStack0000000000000020;
  iStack0000000000000024 = (int)((ulong)_iStack0000000000000020 >> 0x20);
  iStack0000000000000020 = (int)uVar1;
  iStack000000000000001c = (int)((ulong)in_stack_00000018 >> 0x20);
  local_38 = in_RCX;
  local_30 = ___oflag;
  local_28 = __file;
  local_20 = this;
  ip::tcp::family(___oflag);
  ip::tcp::type(local_30);
  ip::tcp::protocol(local_30);
  eVar3 = reactive_socket_service_base::do_open
                    (in_stack_00000030,in_stack_00000028,iStack0000000000000024,
                     iStack0000000000000020,iStack000000000000001c,in_stack_00000010);
  local_48._M_cat = eVar3._M_cat;
  local_48._M_value = eVar3._M_value;
  bVar2 = ::std::error_code::operator_cast_to_bool(&local_48);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    *(int *)(local_28 + 0x10) = local_30->family_;
  }
  local_18 = (int)*local_38;
  return local_18;
}

Assistant:

std::error_code open(implementation_type& impl,
      const protocol_type& protocol, std::error_code& ec)
  {
    if (!do_open(impl, protocol.family(),
          protocol.type(), protocol.protocol(), ec))
      impl.protocol_ = protocol;
    return ec;
  }